

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererTests::RenderingTwoBoundingCellsProducesSpan(RendererTests *this)

{
  bypass_alpha *pbVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  cell *pcVar5;
  bool bVar6;
  allocator local_261;
  string local_260 [32];
  LocationInfo local_240;
  undefined1 auStack_218 [8];
  span reference2 [2];
  string local_1f0 [32];
  LocationInfo local_1d0;
  undefined1 auStack_1a8 [8];
  span reference1 [1];
  bypass_alpha local_189;
  char *pcStack_188;
  cell cells3 [2];
  undefined1 auStack_168 [8];
  cell cells2 [2];
  undefined1 auStack_148 [8];
  cell cells1 [2];
  undefined1 local_120 [8];
  scanline_mockup sl2;
  scanline_mockup sl1;
  RendererTests *this_local;
  int len_2;
  int cover_m_2;
  int area_2;
  int x_2;
  cell *i_2;
  int cover_2;
  int len_1;
  int cover_m_1;
  int area_1;
  int x_1;
  cell *i_1;
  int cover_1;
  int len;
  int cover_m;
  int area;
  int x;
  cell *i;
  int cover;
  
  sl1._32_8_ = this;
  anon_unknown_1::scanline_mockup::scanline_mockup((scanline_mockup *)&sl2._inprogress,true);
  anon_unknown_1::scanline_mockup::scanline_mockup((scanline_mockup *)local_120,true);
  auStack_148._0_4_ = 8;
  auStack_148._4_4_ = 0;
  cells1[0].x = 0x11;
  cells1[0].area = 0xd;
  cells1[0].cover = 0;
  cells1[1].x = -0x11;
  cells2[0].cover = 0;
  cells2[1].x = -0xff;
  auStack_168._0_4_ = 0xb;
  auStack_168._4_4_ = 0;
  cells2[0].x = 0xff;
  cells2[0].area = 199;
  cells3[0].cover = 0;
  cells3[1].x = 100;
  pcStack_188 = "_ZN2ut10setup_implIN4agge5tests9DashTestsEED0Ev";
  cells3[0].x = -100;
  cells3[0].area = 0x13ddfa;
  _area = begin<agge::tests::mocks::cell,2ul>((cell (*) [2])auStack_148);
  pcVar5 = end<agge::tests::mocks::cell,2ul>((cell (*) [2])auStack_148);
  i._4_4_ = 0;
  if (_area != pcVar5) {
    while( true ) {
      cover_m = _area->x;
      len = 0;
      do {
        len = _area->area + len;
        i._4_4_ = _area->cover + i._4_4_;
        _area = _area + 1;
        bVar6 = false;
        if (_area != pcVar5) {
          bVar6 = _area->x == cover_m;
        }
      } while (bVar6);
      iVar2 = i._4_4_ * 0x200;
      if (len != 0) {
        uVar3 = anon_unknown_1::bypass_alpha::operator()(&local_189,iVar2 - len);
        anon_unknown_1::scanline_mockup::add_cell((scanline_mockup *)&sl2._inprogress,cover_m,uVar3)
        ;
        cover_m = cover_m + 1;
      }
      if (_area == pcVar5) break;
      iVar4 = _area->x - cover_m;
      if ((iVar4 != 0) && (iVar2 != 0)) {
        uVar3 = anon_unknown_1::bypass_alpha::operator()(&local_189,iVar2);
        anon_unknown_1::scanline_mockup::add_span
                  ((scanline_mockup *)&sl2._inprogress,cover_m,iVar4,uVar3);
      }
    }
  }
  auStack_1a8._0_4_ = 0x7fffffff;
  auStack_1a8._4_4_ = 8;
  reference1[0].y = 5;
  reference1[0].x = 0x2200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,(allocator *)((long)&reference2[1].cover + 3));
  ut::LocationInfo::LocationInfo(&local_1d0,(string *)local_1f0,0xc2);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [1])auStack_1a8,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)&sl1,&local_1d0);
  ut::LocationInfo::~LocationInfo(&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference2[1].cover + 3));
  _area_1 = begin<agge::tests::mocks::cell,2ul>((cell (*) [2])auStack_168);
  pcVar5 = end<agge::tests::mocks::cell,2ul>((cell (*) [2])auStack_168);
  pbVar1 = (bypass_alpha *)((long)&reference2[1].cover + 2);
  i_1._4_4_ = 0;
  if (_area_1 != pcVar5) {
    while( true ) {
      cover_m_1 = _area_1->x;
      len_1 = 0;
      do {
        len_1 = _area_1->area + len_1;
        i_1._4_4_ = _area_1->cover + i_1._4_4_;
        _area_1 = _area_1 + 1;
        bVar6 = false;
        if (_area_1 != pcVar5) {
          bVar6 = _area_1->x == cover_m_1;
        }
      } while (bVar6);
      iVar2 = i_1._4_4_ * 0x200;
      if (len_1 != 0) {
        uVar3 = anon_unknown_1::bypass_alpha::operator()(pbVar1,iVar2 - len_1);
        anon_unknown_1::scanline_mockup::add_cell((scanline_mockup *)local_120,cover_m_1,uVar3);
        cover_m_1 = cover_m_1 + 1;
      }
      if (_area_1 == pcVar5) break;
      iVar4 = _area_1->x - cover_m_1;
      if ((iVar4 != 0) && (iVar2 != 0)) {
        uVar3 = anon_unknown_1::bypass_alpha::operator()(pbVar1,iVar2);
        anon_unknown_1::scanline_mockup::add_span
                  ((scanline_mockup *)local_120,cover_m_1,iVar4,uVar3);
      }
    }
  }
  _area_2 = begin<agge::tests::mocks::cell,2ul>((cell (*) [2])&pcStack_188);
  pcVar5 = end<agge::tests::mocks::cell,2ul>((cell (*) [2])&pcStack_188);
  pbVar1 = (bypass_alpha *)((long)&reference2[1].cover + 1);
  i_2._4_4_ = 0;
  if (_area_2 != pcVar5) {
    while( true ) {
      cover_m_2 = _area_2->x;
      len_2 = 0;
      do {
        len_2 = _area_2->area + len_2;
        i_2._4_4_ = _area_2->cover + i_2._4_4_;
        _area_2 = _area_2 + 1;
        bVar6 = false;
        if (_area_2 != pcVar5) {
          bVar6 = _area_2->x == cover_m_2;
        }
      } while (bVar6);
      iVar2 = i_2._4_4_ * 0x200;
      if (len_2 != 0) {
        uVar3 = anon_unknown_1::bypass_alpha::operator()(pbVar1,iVar2 - len_2);
        anon_unknown_1::scanline_mockup::add_cell((scanline_mockup *)local_120,cover_m_2,uVar3);
        cover_m_2 = cover_m_2 + 1;
      }
      if (_area_2 == pcVar5) break;
      iVar4 = _area_2->x - cover_m_2;
      if ((iVar4 != 0) && (iVar2 != 0)) {
        uVar3 = anon_unknown_1::bypass_alpha::operator()(pbVar1,iVar2);
        anon_unknown_1::scanline_mockup::add_span
                  ((scanline_mockup *)local_120,cover_m_2,iVar4,uVar3);
      }
    }
  }
  reference2[0].length = 0x7fffffff;
  reference2[0].cover = 0x13d62b;
  reference2[1].y = 1999;
  reference2[1].x = -0xc800;
  auStack_218._0_4_ = 0x7fffffff;
  auStack_218._4_4_ = 0xb;
  reference2[0].y = 0xbc;
  reference2[0].x = 0x1fe00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_261);
  ut::LocationInfo::LocationInfo(&local_240,(string *)local_260,0xce);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,2ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [2])auStack_218,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)&sl2,&local_240);
  ut::LocationInfo::~LocationInfo(&local_240);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  anon_unknown_1::scanline_mockup::~scanline_mockup((scanline_mockup *)local_120);
  anon_unknown_1::scanline_mockup::~scanline_mockup((scanline_mockup *)&sl2._inprogress);
  return;
}

Assistant:

test( RenderingTwoBoundingCellsProducesSpan )
			{
				// INIT
				scanline_mockup sl1, sl2;
				mocks::cell cells1[] = { { 8, 0, 17 }, { 13, 0, -17 }, };
				mocks::cell cells2[] = { { 11, 0, 255 }, { 199, 0, -255 }, };
				mocks::cell cells3[] = { { 1300011, 0, -100 }, { 1302010, 0, 100 }, };

				// ACT
				sweep_scanline<8>(sl1, begin(cells1), end(cells1), bypass_alpha());

				// ASSERT
				span reference1[] = {
					{ 0x7fffffff, 8, 5, 17 * 512 },
				};

				assert_equal(reference1, sl1.spans_log);

				// ACT
				sweep_scanline<8>(sl2, begin(cells2), end(cells2), bypass_alpha());
				sweep_scanline<8>(sl2, begin(cells3), end(cells3), bypass_alpha());

				// ASSERT
				span reference2[] = {
					{ 0x7fffffff, 11, 188, 255 * 512 },
					{ 0x7fffffff, 1300011, 1999, -100 * 512 },
				};

				assert_equal(reference2, sl2.spans_log);
			}